

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void av1_set_offsets_without_segment_id
               (AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  byte bVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  uint uVar4;
  bool bVar5;
  uint plane_end;
  int mi_ext_col;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  MB_MODE_INFO *pMVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  MB_MODE_INFO **ppMVar17;
  int iVar18;
  ENTROPY_CONTEXT **ppEVar19;
  int iVar20;
  undefined7 in_register_00000089;
  ENTROPY_CONTEXT (*paEVar21) [32];
  byte bVar22;
  long lVar23;
  byte bVar24;
  
  plane_end = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
  uVar13 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar13];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar13];
  iVar11 = (cpi->common).mi_params.mi_stride;
  iVar16 = iVar11 * mi_row + mi_col;
  iVar10 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [(cpi->common).mi_params.mi_alloc_bsize];
  iVar6 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  (cpi->common).mi_params.mi_grid_base[iVar16] =
       (cpi->common).mi_params.mi_alloc + ((cpi->common).mi_params.mi_alloc_stride * iVar10 + iVar6)
  ;
  ppMVar17 = (cpi->common).mi_params.mi_grid_base + iVar16;
  (x->e_mbd).mi = ppMVar17;
  (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar16;
  (x->e_mbd).tx_type_map_stride = iVar11;
  x->mbmi_ext_frame =
       (cpi->mbmi_ext_info).frame_base + (iVar10 * (cpi->mbmi_ext_info).stride + iVar6);
  uVar7 = mi_row - 1;
  ppEVar19 = (x->e_mbd).above_entropy_context;
  paEVar21 = (x->e_mbd).left_entropy_context;
  lVar23 = 0;
  uVar9 = mi_row;
  iVar11 = mi_col;
  do {
    BVar3 = (*ppMVar17)->bsize;
    iVar6 = *(int *)((long)(x->e_mbd).plane[0].pre + lVar23 * 8 + -0x2c);
    uVar15 = uVar7;
    if ((0x20005UL >> (BVar3 & 0x3f) & 1) == 0) {
      uVar15 = uVar9;
    }
    iVar10 = *(int *)((long)(x->e_mbd).plane[0].pre + lVar23 * 8 + -0x28);
    if (iVar10 == 0) {
      uVar15 = uVar9;
    }
    if ((mi_row & 1U) != 0) {
      uVar9 = uVar15;
    }
    iVar16 = mi_col + -1;
    if ((0x10003UL >> (BVar3 & 0x3f) & 1) == 0) {
      iVar16 = iVar11;
    }
    if (iVar6 == 0) {
      iVar16 = iVar11;
    }
    if ((mi_col & 1U) != 0) {
      iVar11 = iVar16;
    }
    *(ENTROPY_CONTEXT **)((x->e_mbd).plane[0].seg_dequant_QTX + lVar23 * 2 + -4) =
         *ppEVar19 + (iVar11 >> ((byte)iVar6 & 0x1f));
    *(ENTROPY_CONTEXT **)((x->e_mbd).plane[0].seg_dequant_QTX + lVar23 * 2 + -2) =
         *paEVar21 + ((uVar9 & 0x1f) >> ((byte)iVar10 & 0x1f));
    lVar23 = lVar23 + 0x146;
    paEVar21 = paEVar21 + 1;
    ppEVar19 = ppEVar19 + 1;
  } while ((ulong)plane_end * 0x146 - lVar23 != 0);
  (x->e_mbd).above_txfm_context = (cpi->common).above_contexts.txfm[tile->tile_row] + mi_col;
  (x->e_mbd).left_txfm_context = (x->e_mbd).left_txfm_context_buffer + (mi_row & 0x1f);
  lVar23 = 0;
  av1_setup_dst_planes
            ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
  iVar11 = (cpi->oxcf).border_in_pixels;
  iVar6 = (cpi->common).mi_params.mi_rows;
  iVar10 = (cpi->common).mi_params.mi_cols;
  iVar20 = 8 - (iVar11 + mi_row * 4);
  iVar18 = (uint)bVar2 + mi_row;
  iVar16 = iVar18 * -4 + -8;
  if (iVar16 < iVar20) {
    iVar16 = iVar20;
  }
  iVar8 = iVar6 - mi_row;
  iVar20 = iVar8 * 4 + 8;
  iVar8 = iVar11 + (iVar8 - (uint)bVar2) * 4 + -8;
  if (iVar8 < iVar20) {
    iVar20 = iVar8;
  }
  (x->mv_limits).row_min = iVar16;
  (x->mv_limits).row_max = iVar20;
  iVar20 = 8 - (iVar11 + mi_col * 4);
  uVar9 = (uint)bVar1 + mi_col;
  iVar16 = uVar9 * -4 + -8;
  if (iVar16 < iVar20) {
    iVar16 = iVar20;
  }
  (x->mv_limits).col_min = iVar16;
  iVar20 = iVar10 - mi_col;
  iVar16 = iVar20 * 4 + 8;
  iVar11 = iVar11 + (iVar20 - (uint)bVar1) * 4 + -8;
  if (iVar11 < iVar16) {
    iVar16 = iVar11;
  }
  (x->mv_limits).col_max = iVar16;
  do {
    bVar22 = (byte)((uint)bVar2 * 4 >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar23 + -0x28) & 0x1f));
    bVar24 = (byte)((uint)bVar1 * 4 >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar23 + -0x2c) & 0x1f));
    if (bVar24 < 5) {
      bVar24 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar23 + 0x90) = bVar24;
    if (bVar22 < 5) {
      bVar22 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar23 + 0x91) = bVar22;
    lVar23 = lVar23 + 0xa30;
  } while ((ulong)plane_end * 0xa30 - lVar23 != 0);
  iVar11 = tile->mi_row_start;
  iVar16 = tile->mi_col_start;
  (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
  (x->e_mbd).mb_to_bottom_edge = (iVar6 - iVar18) * 0x20;
  (x->e_mbd).mb_to_left_edge = mi_col * -0x20;
  (x->e_mbd).mb_to_right_edge = (iVar10 - uVar9) * 0x20;
  (x->e_mbd).mi_row = mi_row;
  (x->e_mbd).mi_col = mi_col;
  (x->e_mbd).left_available = iVar16 < mi_col;
  (x->e_mbd).up_available = iVar11 < mi_row;
  uVar15 = (x->e_mbd).plane[1].subsampling_x;
  uVar4 = (x->e_mbd).plane[1].subsampling_y;
  (x->e_mbd).chroma_up_available = iVar11 < mi_row;
  bVar5 = iVar11 < mi_row;
  bVar14 = iVar16 < mi_col + -1;
  if (uVar15 == 0) {
    bVar14 = iVar16 < mi_col;
  }
  if ((0x3efffcUL >> ((ulong)bsize & 0x3f) & 1) != 0) {
    bVar14 = iVar16 < mi_col;
  }
  (x->e_mbd).chroma_left_available = bVar14;
  if ((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0 && uVar4 != 0) {
    bVar5 = iVar11 < (int)uVar7;
    (x->e_mbd).chroma_up_available = iVar11 < (int)uVar7;
  }
  if (iVar11 < mi_row) {
    pMVar12 = (x->e_mbd).mi[-(long)(x->e_mbd).mi_stride];
  }
  else {
    pMVar12 = (MB_MODE_INFO *)0x0;
  }
  (x->e_mbd).above_mbmi = pMVar12;
  if (iVar16 < mi_col) {
    pMVar12 = (x->e_mbd).mi[-1];
  }
  else {
    pMVar12 = (MB_MODE_INFO *)0x0;
  }
  (x->e_mbd).left_mbmi = pMVar12;
  if (((mi_row & 1U) == 0) && ((bVar2 & uVar4 != 0) != 0)) {
    (x->e_mbd).is_chroma_ref = false;
  }
  else {
    if (((mi_col & 1U) == 0) && ((bVar1 & 1) != 0)) {
      (x->e_mbd).is_chroma_ref = uVar15 == 0;
      if (uVar15 != 0) goto LAB_001eedc4;
    }
    else {
      (x->e_mbd).is_chroma_ref = true;
    }
    iVar11 = (x->e_mbd).mi_stride;
    iVar6 = (uVar15 & mi_col) + (uVar4 & mi_row) * iVar11;
    ppMVar17 = (x->e_mbd).mi;
    if (bVar5) {
      pMVar12 = ppMVar17[(long)-iVar6 + (long)(int)(uVar15 - iVar11)];
    }
    else {
      pMVar12 = (MB_MODE_INFO *)0x0;
    }
    (x->e_mbd).chroma_above_mbmi = pMVar12;
    if (bVar14 == false) {
      pMVar12 = (MB_MODE_INFO *)0x0;
    }
    else {
      pMVar12 = ppMVar17[(long)-iVar6 + (long)(int)(iVar11 * uVar4) + -1];
    }
    (x->e_mbd).chroma_left_mbmi = pMVar12;
  }
LAB_001eedc4:
  (x->e_mbd).height = bVar2;
  (x->e_mbd).width = bVar1;
  (x->e_mbd).is_last_vertical_rect = false;
  if ((bVar1 < bVar2) && ((bVar2 - 1 & uVar9) == 0)) {
    (x->e_mbd).is_last_vertical_rect = true;
  }
  (x->e_mbd).is_first_horizontal_rect = false;
  if ((bVar2 < bVar1) && ((bVar1 - 1 & mi_row) == 0)) {
    (x->e_mbd).is_first_horizontal_rect = true;
  }
  av1_setup_src_planes(x,cpi->source,mi_row,mi_col,plane_end,bsize);
  iVar11 = tile->tile_col;
  (x->e_mbd).tile.tile_row = tile->tile_row;
  (x->e_mbd).tile.tile_col = iVar11;
  iVar11 = tile->mi_row_end;
  iVar6 = tile->mi_col_start;
  iVar10 = tile->mi_col_end;
  (x->e_mbd).tile.mi_row_start = tile->mi_row_start;
  (x->e_mbd).tile.mi_row_end = iVar11;
  (x->e_mbd).tile.mi_col_start = iVar6;
  (x->e_mbd).tile.mi_col_end = iVar10;
  return;
}

Assistant:

void av1_set_offsets_without_segment_id(const AV1_COMP *const cpi,
                                        const TileInfo *const tile,
                                        MACROBLOCK *const x, int mi_row,
                                        int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];

  set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                        mi_row, mi_col);

  set_entropy_context(xd, mi_row, mi_col, num_planes);
  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Set up destination pointers.
  av1_setup_dst_planes(xd->plane, bsize, &cm->cur_frame->buf, mi_row, mi_col, 0,
                       num_planes);

  // Set up limit values for MV components.
  // Mv beyond the range do not produce new/different prediction block.
  av1_set_mv_limits(&cm->mi_params, &x->mv_limits, mi_row, mi_col, mi_height,
                    mi_width, cpi->oxcf.border_in_pixels);

  set_plane_n4(xd, mi_width, mi_height, num_planes);

  // Set up distance of MB to edge of frame in 1/8th pel units.
  assert(!(mi_col & (mi_width - 1)) && !(mi_row & (mi_height - 1)));
  set_mi_row_col(xd, tile, mi_row, mi_height, mi_col, mi_width,
                 cm->mi_params.mi_rows, cm->mi_params.mi_cols);

  // Set up source buffers.
  av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);

  // required by av1_append_sub8x8_mvs_for_idx() and av1_find_best_ref_mvs()
  xd->tile = *tile;
}